

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O1

int do_iaf_psc(int argc,char **argv)

{
  FILE *__stream;
  _Bool _Var1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  img *__ptr;
  undefined8 uVar6;
  code *pcVar7;
  char *p_path;
  char **argv_1;
  char **argv_00;
  int argc_1;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  long in_FS_OFFSET;
  igsc_device_handle handle;
  char *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc < 1) {
    iVar2 = -1;
    if (quiet == 0) {
      do_iaf_psc_cold_7();
    }
  }
  else {
    pcVar9 = *argv;
    uVar5 = argc - 1;
    argv_00 = argv + 1;
    _Var1 = arg_is_token(pcVar9,"update");
    if (_Var1) {
      if (argc == 1) {
        iVar2 = -1;
        if (quiet == 0) {
          do_iaf_psc_cold_6();
        }
      }
      else {
        pcVar10 = (char *)0x0;
        p_path = (char *)0x0;
        do {
          pcVar9 = *argv_00;
          _Var1 = arg_is_quiet(pcVar9);
          if (_Var1) {
            quiet = 1;
            uVar8 = uVar5;
          }
          else {
            _Var1 = arg_is_device(pcVar9);
            if (_Var1) {
              if (uVar5 < 2) {
                iVar2 = -1;
                if (quiet == 0) {
                  do_iaf_psc_cold_2();
                }
                goto LAB_00106a47;
              }
              pcVar10 = argv_00[1];
            }
            else {
              _Var1 = arg_is_image(pcVar9);
              if (!_Var1) goto joined_r0x0010686d;
              if (uVar5 < 2) {
                iVar2 = -1;
                if (quiet == 0) {
                  do_iaf_psc_cold_1();
                }
                goto LAB_00106a47;
              }
              p_path = argv_00[1];
            }
            argv_00 = argv_00 + 1;
            uVar8 = uVar5 - 1;
            if (uVar5 == 0) {
              uVar8 = 0;
            }
          }
          argv_00 = argv_00 + (uVar8 != 0);
          uVar5 = uVar8 - 1;
          if (uVar8 == 0) {
            uVar5 = 0;
          }
        } while (uVar8 != 0 && uVar8 - 1 != 0);
        if (p_path == (char *)0x0) {
          iVar2 = -1;
          if (quiet == 0) {
            do_iaf_psc_cold_5();
          }
        }
        else {
          local_48 = (char *)0x0;
          local_40 = 0;
          if ((pcVar10 == (char *)0x0) &&
             (iVar2 = get_first_device(&local_48), pcVar10 = local_48,
             local_48 == (char *)0x0 || iVar2 != 0)) {
            iVar2 = 1;
            if (quiet == 0) {
              do_iaf_psc_cold_4();
            }
          }
          else {
            __ptr = image_read_from_file(p_path);
            if (__ptr == (img *)0x0) {
              iVar3 = 1;
              iVar2 = 1;
              if (quiet == 0) {
                pcVar9 = "Error: Failed to read :%s\n";
LAB_0010698a:
                fprintf(_stderr,pcVar9,p_path);
                iVar2 = iVar3;
              }
            }
            else {
              iVar3 = igsc_device_init_by_device(&local_40,pcVar10);
              if (iVar3 == 0) {
                pcVar7 = progress_percentage_func;
                if ((quiet & 1) != 0) {
                  pcVar7 = (code *)0x0;
                }
                iVar3 = igsc_iaf_psc_update(&local_40,__ptr + 1,__ptr->size,pcVar7,0);
                if (quiet == 0) {
                  putchar(10);
                }
                iVar2 = 0;
                if (iVar3 != 0) {
                  if (quiet == 0) {
                    do_iaf_psc_cold_3();
                  }
                  __stream = _stdout;
                  iVar2 = iVar3;
                  if (quiet == 0) {
                    uVar4 = igsc_get_last_firmware_status(&local_40);
                    uVar6 = igsc_translate_firmware_status(uVar4);
                    uVar5 = igsc_get_last_firmware_status(&local_40);
                    fprintf(__stream,"Firmware status: %s (0x%x)\n",uVar6,(ulong)uVar5);
                  }
                }
              }
              else {
                iVar2 = iVar3;
                if ((quiet & 1) == 0) {
                  pcVar9 = "Error: Cannot initialize device: %s\n";
                  p_path = pcVar10;
                  goto LAB_0010698a;
                }
              }
            }
            igsc_device_close(&local_40);
            free(__ptr);
            free(local_48);
          }
        }
      }
    }
    else {
      _Var1 = arg_is_token(pcVar9,"version");
      if (_Var1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          iVar2 = do_no_special_args_func(uVar5,argv_00,iaf_psc_version);
          return iVar2;
        }
        goto LAB_00106a72;
      }
joined_r0x0010686d:
      iVar2 = -1;
      if (quiet == 0) {
        iVar2 = -1;
        fprintf(_stderr,"Error: Wrong argument %s\n",pcVar9);
      }
    }
  }
LAB_00106a47:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
LAB_00106a72:
  __stack_chk_fail();
}

Assistant:

static int do_iaf_psc(int argc, char *argv[])
{
    const char *sub_command = NULL;

    if (argc <= 0)
    {
        fwupd_error("Missing arguments\n");
        return ERROR_BAD_ARGUMENT;
    }

    sub_command = argv[0];

    arg_next(&argc, &argv);

    if (arg_is_token(sub_command, "update"))
    {
        return do_iaf_psc_update(argc, argv);
    }

    if (arg_is_token(sub_command, "version"))
    {
        return do_iaf_psc_version(argc, argv);
    }

    fwupd_error("Wrong argument %s\n", sub_command);
    return ERROR_BAD_ARGUMENT;
}